

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

double __thiscall pstore::basic_logger::log(basic_logger *this,double __x)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  czstring __s;
  undefined8 uVar4;
  undefined8 *in_RDX;
  priority in_ESI;
  double dVar5;
  array<char,_25UL> time_buffer;
  ostringstream str;
  time_t in_stack_fffffffffffffe18;
  char local_1e0;
  undefined7 uStack_1df;
  long local_1d0 [2];
  char local_1b9 [24];
  undefined1 local_1a1;
  tm local_1a0 [2];
  ios_base local_130 [264];
  
  time((time_t *)0x0);
  local_time(in_stack_fffffffffffffe18);
  sVar2 = strftime(local_1b9,0x19,"%FT%T%z",local_1a0);
  local_1a1 = 0;
  if (sVar2 != 0x18) {
    assert_failed("r == sizeof (time_buffer) - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/logging.cpp"
                  ,0x162);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  sVar2 = strlen(local_1b9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,local_1b9,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," - ",3);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(this->thread_name_)._M_dataplus._M_p,
                      (this->thread_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," - ",3);
  __s = priority_string(in_ESI);
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," - ",3);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)*in_RDX,in_RDX[1]);
  local_1e0 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1e0,1);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)mutex_);
  if (iVar1 == 0) {
    std::__cxx11::stringbuf::str();
    (*(this->super_logger)._vptr_logger[0xc])(this,&local_1e0);
    if ((long *)CONCAT71(uStack_1df,local_1e0) != local_1d0) {
      operator_delete((long *)CONCAT71(uStack_1df,local_1e0),local_1d0[0] + 1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)mutex_);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    dVar5 = (double)std::ios_base::~ios_base(local_130);
    return dVar5;
  }
  uVar4 = std::__throw_system_error(iVar1);
  if ((long *)CONCAT71(uStack_1df,local_1e0) != local_1d0) {
    operator_delete((long *)CONCAT71(uStack_1df,local_1e0),local_1d0[0] + 1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  _Unwind_Resume(uVar4);
}

Assistant:

void basic_logger::log (priority const p, std::string const & message) {
            std::array<char, time_buffer_size> time_buffer;
            std::size_t const r = time_string (std::time (nullptr), ::gsl::make_span (time_buffer));
            (void) r;
            PSTORE_ASSERT (r == sizeof (time_buffer) - 1);
            gsl::czstring const time_str = time_buffer.data ();
            std::ostringstream str;
            str << time_str << " - " << thread_name_ << " - " << priority_string (p) << " - "
                << message << '\n';

            std::lock_guard<std::mutex> const lock (mutex_);
            this->log_impl (str.str ());
        }